

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanCommandBuffer.hpp
# Opt level: O1

void __thiscall
VulkanUtilities::VulkanCommandBuffer::ResetQueryPool
          (VulkanCommandBuffer *this,VkQueryPool queryPool,uint32_t firstQuery,uint32_t queryCount)

{
  undefined4 in_register_0000000c;
  string msg;
  string local_48;
  
  if (this->m_VkCmdBuffer == (VkCommandBuffer)0x0) {
    Diligent::FormatString<char[26],char[32]>
              (&local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkCmdBuffer != VK_NULL_HANDLE",
               (char (*) [32])CONCAT44(in_register_0000000c,queryCount));
    Diligent::DebugAssertionFailed
              (local_48._M_dataplus._M_p,"ResetQueryPool",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x286);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->m_State).RenderPass == (VkRenderPass)0x0) {
    if ((this->m_State).DynamicRenderingHash != 0) {
      EndRendering(this);
    }
  }
  else {
    EndRenderPass(this);
  }
  FlushBarriers(this);
  (*vkCmdResetQueryPool)(this->m_VkCmdBuffer,queryPool,firstQuery,queryCount);
  return;
}

Assistant:

__forceinline void ResetQueryPool(VkQueryPool queryPool,
                                      uint32_t    firstQuery,
                                      uint32_t    queryCount)
    {
        VERIFY_EXPR(m_VkCmdBuffer != VK_NULL_HANDLE);
        // Query pool reset must be performed outside of render pass (17.2).
        EndRenderScope();
        FlushBarriers();
        vkCmdResetQueryPool(m_VkCmdBuffer, queryPool, firstQuery, queryCount);
    }